

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Button.cpp
# Opt level: O0

void __thiscall gui::Button::handleMouseRelease(Button *this,Button button,Vector2f *mouseParent)

{
  Widget *in_RDX;
  Button in_ESI;
  Widget *in_RDI;
  Vector2f this_00;
  undefined4 unaff_retaddr;
  Button unaff_retaddr_00;
  Vector2f mouseLocal;
  Vector2f *in_stack_ffffffffffffffe0;
  Widget *funcArgs_2;
  
  funcArgs_2 = in_RDI;
  this_00 = Widget::toLocalOriginSpace(in_RDX,in_stack_ffffffffffffffe0);
  if (((int)in_ESI < 3) &&
     ((*(byte *)((long)&in_RDI[1].onFocusLost.callbacks_._M_t._M_impl.super__Rb_tree_header.
                        _M_header._M_left + 1) & 1) != 0)) {
    setPressed((Button *)this_00,SUB81((ulong)in_RDI >> 0x38,0));
    Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::emit
              ((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)mouseParent,(Widget *)mouseLocal
               ,(Vector2<float> *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  }
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::emit
            ((Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&> *)mouseParent,
             (Widget *)mouseLocal,unaff_retaddr_00,(Vector2<float> *)funcArgs_2);
  Widget::handleMouseRelease(in_RDI,in_ESI,(Vector2f *)in_RDX);
  return;
}

Assistant:

void Button::handleMouseRelease(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    if (button <= sf::Mouse::Middle && isPressed_) {
        setPressed(false);
        onClick.emit(this, mouseLocal);
    }
    onMouseRelease.emit(this, button, mouseLocal);
    baseClass::handleMouseRelease(button, mouseParent);
}